

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

void aiMultiplyMatrix4(aiMatrix4x4 *dst,aiMatrix4x4 *src)

{
  aiMatrix4x4t<float> local_58;
  aiMatrix4x4 *local_18;
  aiMatrix4x4 *src_local;
  aiMatrix4x4 *dst_local;
  
  local_18 = src;
  src_local = dst;
  if (dst == (aiMatrix4x4 *)0x0) {
    __assert_fail("__null != dst",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x283,"void aiMultiplyMatrix4(aiMatrix4x4 *, const aiMatrix4x4 *)");
  }
  if (src != (aiMatrix4x4 *)0x0) {
    aiMatrix4x4t<float>::operator*(&local_58,dst,src);
    memcpy(src_local,&local_58,0x40);
    return;
  }
  __assert_fail("__null != src",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x284,"void aiMultiplyMatrix4(aiMatrix4x4 *, const aiMatrix4x4 *)");
}

Assistant:

ASSIMP_API void aiMultiplyMatrix4(
    aiMatrix4x4* dst,
    const aiMatrix4x4* src)
{
    ai_assert( NULL != dst );
    ai_assert( NULL != src );
    *dst = (*dst) * (*src);
}